

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

ParseableFunctionInfo * __thiscall Js::FunctionProxy::EnsureDeserialized(FunctionProxy *this)

{
  Type *addr;
  FunctionInfo *pFVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  FunctionBody *pFVar6;
  
  if ((((this->functionInfo).ptr)->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x81a,"(this == this->GetFunctionInfo()->GetFunctionProxy())",
                                "this == this->GetFunctionInfo()->GetFunctionProxy()");
    if (!bVar3) goto LAB_0076a10c;
    *puVar5 = 0;
  }
  if ((this->functionInfo).ptr == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x530,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) goto LAB_0076a10c;
    *puVar5 = 0;
  }
  if ((((this->functionInfo).ptr)->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x531,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar3) goto LAB_0076a10c;
    *puVar5 = 0;
  }
  if ((((this->functionInfo).ptr)->attributes & DeferredDeserialize) != None) {
    iVar4 = (*(this->m_scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
    if ((char)iVar4 != '\0') {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x821,"(!m_scriptContext->IsClosed())",
                                  "!m_scriptContext->IsClosed()");
      if (!bVar3) goto LAB_0076a10c;
      *puVar5 = 0;
    }
    pFVar6 = DeferDeserializeFunctionInfo::Deserialize((DeferDeserializeFunctionInfo *)this);
    pFVar1 = (this->functionInfo).ptr;
    addr = &pFVar1->functionBodyImpl;
    Memory::Recycler::WBSetBit((char *)addr);
    (pFVar1->functionBodyImpl).ptr = (FunctionProxy *)pFVar6;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    if ((((pFVar6->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
        functionBodyImpl).ptr == (FunctionProxy *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x825,"(executionFunctionBody->GetFunctionInfo()->HasBody())",
                                  "executionFunctionBody->GetFunctionInfo()->HasBody()");
      if (!bVar3) goto LAB_0076a10c;
      *puVar5 = 0;
    }
    bVar3 = pFVar6 == (FunctionBody *)this;
    this = (FunctionProxy *)pFVar6;
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x826,"(executionFunctionBody != this)",
                                  "executionFunctionBody != this");
      if (!bVar3) {
LAB_0076a10c:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
  }
  return &((FunctionBody *)this)->super_ParseableFunctionInfo;
}

Assistant:

ParseableFunctionInfo * FunctionProxy::EnsureDeserialized()
    {
        Assert(this == this->GetFunctionInfo()->GetFunctionProxy());
        FunctionProxy * executionFunctionBody = this;

        if (IsDeferredDeserializeFunction())
        {
            // No need to deserialize function body if scriptContext closed because we can't execute it.
            // Bigger problem is the script engine might have released bytecode file mapping and we can't deserialize.
            Assert(!m_scriptContext->IsClosed());

            executionFunctionBody = ((DeferDeserializeFunctionInfo*) this)->Deserialize();
            this->GetFunctionInfo()->SetFunctionProxy(executionFunctionBody);
            Assert(executionFunctionBody->GetFunctionInfo()->HasBody());
            Assert(executionFunctionBody != this);
        }

        return (ParseableFunctionInfo *)executionFunctionBody;
    }